

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O0

exr_result_t exr_attr_string_vector_destroy(exr_context_t ctxt,exr_attr_string_vector_t *sv)

{
  int *in_RSI;
  long in_RDI;
  int32_t i;
  exr_attr_string_t *strs;
  exr_attr_string_vector_t nil;
  int local_34;
  exr_attr_string_t *s;
  exr_context_t in_stack_ffffffffffffffd8;
  undefined8 local_20;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (int *)0x0) {
      memset(&stack0xffffffffffffffd8,0,0x10);
      if (0 < in_RSI[1]) {
        s = *(exr_attr_string_t **)(in_RSI + 2);
        for (local_34 = 0; local_34 < *in_RSI; local_34 = local_34 + 1) {
          exr_attr_string_destroy(in_stack_ffffffffffffffd8,s);
        }
        if (s != (exr_attr_string_t *)0x0) {
          (**(code **)(in_RDI + 0x60))(s);
        }
      }
      *(exr_context_t *)in_RSI = in_stack_ffffffffffffffd8;
      *(undefined8 *)(in_RSI + 2) = local_20;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_vector_destroy (
    exr_context_t ctxt, exr_attr_string_vector_t* sv)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (sv)
    {
        exr_attr_string_vector_t nil = {0};
        if (sv->alloc_size > 0)
        {
            exr_attr_string_t* strs =
                EXR_CONST_CAST (exr_attr_string_t*, sv->strings);
            for (int32_t i = 0; i < sv->n_strings; ++i)
                exr_attr_string_destroy (ctxt, strs + i);
            if (strs) ctxt->free_fn (strs);
        }
        *sv = nil;
    }
    return EXR_ERR_SUCCESS;
}